

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

RIP * __thiscall ASDCP::MXF::RIP::InitFromFile(RIP *this,IFileReader *Reader)

{
  bool bVar1;
  int iVar2;
  byte_t *value;
  ILogSink *pIVar3;
  UL *in_RDX;
  Result_t local_138 [104];
  undefined1 local_d0 [8];
  MemIOReader MemRDR;
  UL local_a8;
  undefined1 local_88 [8];
  Result_t result;
  IFileReader *Reader_local;
  RIP *this_local;
  
  if (*(long *)(Reader + 0x70) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x7b,
                  "virtual ASDCP::Result_t ASDCP::MXF::RIP::InitFromFile(const Kumu::IFileReader &)"
                 );
  }
  value = Dictionary::ul(*(Dictionary **)(Reader + 0x70),MDD_RandomIndexMetadata);
  UL::UL(&local_a8,value);
  KLVFilePacket::InitFromFile((KLVFilePacket *)local_88,Reader,in_RDX);
  UL::~UL(&local_a8);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (-1 < iVar2) {
    if (*(ulong *)(Reader + 0x20) < 4) {
      pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar3,"RIP is too short.\n");
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_00235892;
    }
    Kumu::MemIOReader::MemIOReader
              ((MemIOReader *)local_d0,*(byte_t **)(Reader + 0x18),*(int *)(Reader + 0x20) - 4);
    bVar1 = SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Unarchive
                      ((SimpleArray<ASDCP::MXF::RIP::PartitionPair> *)(Reader + 0x78),
                       (MemIOReader *)local_d0);
    if (bVar1) {
      Kumu::Result_t::Result_t(local_138,(Result_t *)Kumu::RESULT_OK);
    }
    else {
      Kumu::Result_t::operator()((int *)local_138,ASDCP::RESULT_KLV_CODING);
    }
    Kumu::Result_t::operator=((Result_t *)local_88,local_138);
    Kumu::Result_t::~Result_t(local_138);
    Kumu::MemIOReader::~MemIOReader((MemIOReader *)local_d0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (iVar2 < 0) {
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"Failed to initialize RIP.\n");
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_88);
LAB_00235892:
  MemRDR.m_size = 1;
  Kumu::Result_t::~Result_t((Result_t *)local_88);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::RIP::InitFromFile(const Kumu::IFileReader& Reader)
{
  assert(m_Dict);
  Result_t result = KLVFilePacket::InitFromFile(Reader, m_Dict->ul(MDD_RandomIndexMetadata));

  if ( ASDCP_SUCCESS(result) )
    {
      if (m_ValueLength < 4)
      {
        DefaultLogSink().Error("RIP is too short.\n");
        return RESULT_KLV_CODING(__LINE__, __FILE__);
      }
      Kumu::MemIOReader MemRDR(m_ValueStart, m_ValueLength - 4);
      result = PairArray.Unarchive(&MemRDR) ? RESULT_OK : RESULT_KLV_CODING(__LINE__, __FILE__);
    }

  if ( ASDCP_FAILURE(result) )
    DefaultLogSink().Error("Failed to initialize RIP.\n");

  return result;
}